

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformFuncCall(Transformer *this,PGFuncCall *root)

{
  long lVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> uVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  PGList *pPVar4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  pointer pOVar6;
  undefined8 uVar7;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> oVar8;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  size_type sVar11;
  bool bVar12;
  ExpressionType EVar13;
  char cVar14;
  int iVar15;
  Transformer *this_00;
  type pPVar16;
  ParserException *pPVar17;
  pointer pWVar18;
  pointer pOVar19;
  reference pvVar20;
  iterator iVar21;
  type pWVar22;
  reference pvVar23;
  CaseExpression *this_01;
  pointer pCVar24;
  unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_> uVar25;
  reference __b;
  type expr;
  pointer pOVar26;
  _Head_base<0UL,_duckdb::FunctionExpression_*,_false> _Var27;
  InternalException *pIVar28;
  uint uVar29;
  ExpressionType type;
  long in_RDX;
  pointer *__ptr_1;
  pointer *__ptr_2;
  undefined8 uVar30;
  PGFuncCall *this_02;
  pointer *__ptr;
  char *pcVar31;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [24];
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_spec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  optional_idx local_188;
  optional_ptr<duckdb_libpgquery::PGWindowDef,_true> window_ref;
  ExpressionType win_fun_type;
  undefined7 uStack_16f;
  string local_168;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  local_148;
  bool local_139;
  string lowercase_name;
  string function_name;
  string schema;
  string catalog;
  pointer local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = *(long *)(in_RDX + 8);
  catalog._M_dataplus._M_p = (pointer)&catalog.field_2;
  catalog._M_string_length = 0;
  catalog.field_2._M_local_buf[0] = '\0';
  schema._M_dataplus._M_p = (pointer)&schema.field_2;
  schema._M_string_length = 0;
  schema.field_2._M_local_buf[0] = '\0';
  function_name._M_dataplus._M_p = (pointer)&function_name.field_2;
  function_name._M_string_length = 0;
  function_name.field_2._M_local_buf[0] = '\0';
  iVar15 = *(int *)(lVar1 + 4);
  local_148._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)this;
  if (iVar15 == 1) {
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)0x0,0x1f53803);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)schema._M_string_length,0x1f53803);
    local_1c8._0_8_ = **(undefined8 **)(lVar1 + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = function_name._M_string_length;
    uVar2.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen((char *)uVar2.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
    ::std::__cxx11::string::_M_replace
              ((ulong)&function_name,0,(char *)sVar11,
               (ulong)uVar2.
                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
  }
  else if (iVar15 == 2) {
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)0x0,0x1f53803);
    local_1c8._0_8_ = **(long **)(lVar1 + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = schema._M_string_length;
    pcVar31 = ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen(pcVar31);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)sVar11,(ulong)pcVar31);
    local_1c8._0_8_ = **(undefined8 **)(*(long *)(lVar1 + 8) + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = function_name._M_string_length;
    uVar2.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen((char *)uVar2.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
    ::std::__cxx11::string::_M_replace
              ((ulong)&function_name,0,(char *)sVar11,
               (ulong)uVar2.
                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
  }
  else {
    if (iVar15 != 3) {
      pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
      local_1c8._0_8_ = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"TransformFuncCall - Expected 1, 2 or 3 qualifications","");
      ParserException::ParserException(pPVar17,(string *)local_1c8);
      __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1c8._0_8_ = **(long **)(lVar1 + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = catalog._M_string_length;
    pcVar31 = ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen(pcVar31);
    ::std::__cxx11::string::_M_replace((ulong)&catalog,0,(char *)sVar11,(ulong)pcVar31);
    local_1c8._0_8_ = **(long **)(*(long *)(lVar1 + 8) + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = schema._M_string_length;
    pcVar31 = ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen(pcVar31);
    ::std::__cxx11::string::_M_replace((ulong)&schema,0,(char *)sVar11,(ulong)pcVar31);
    local_1c8._0_8_ = **(undefined8 **)(*(long *)(*(long *)(lVar1 + 8) + 8) + 8);
    optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_1c8);
    sVar11 = function_name._M_string_length;
    uVar2.super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ((ValUnion *)(local_1c8._0_8_ + 8))->str;
    strlen((char *)uVar2.
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
    ::std::__cxx11::string::_M_replace
              ((ulong)&function_name,0,(char *)sVar11,
               (ulong)uVar2.
                      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl);
  }
  local_198._M_allocated_capacity = 0;
  local_198._8_8_ = (pointer)0x0;
  local_188.index = 0;
  if ((*(PGList **)(in_RDX + 0x10) != (PGList *)0x0) &&
     (TransformExpressionList
                ((Transformer *)root,*(PGList **)(in_RDX + 0x10),
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_198), local_198._8_8_ - local_198._0_8_ == 8)) {
    this_00 = (Transformer *)
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_198,0);
    pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this_00);
    bVar12 = ExpressionIsEmptyStar(this_00,pPVar16);
    uVar9 = local_198._8_8_;
    uVar7 = local_198._M_allocated_capacity;
    if ((bVar12) &&
       (((*(char *)(in_RDX + 0x2b) == '\0' && (*(long *)(in_RDX + 0x18) == 0)) &&
        (uVar30 = local_198._M_allocated_capacity,
        local_198._8_8_ != local_198._M_allocated_capacity)))) {
      do {
        _Var3._M_head_impl =
             (((pointer)uVar30)->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
        (((pointer)uVar30)->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (ParsedExpression *)0x0;
        uVar30 = uVar30 + 8;
      } while (uVar30 != uVar9);
      local_198._8_8_ = uVar7;
    }
  }
  StringUtil::Lower(&lowercase_name,&function_name);
  if (*(long *)(in_RDX + 0x38) != 0) {
    this_02 = root;
    if (root[2].func_variadic == false) {
      do {
        if (*(long *)this_02 == 0) {
          EVar13 = WindowExpression::WindowToExpressionType(&lowercase_name);
          win_fun_type = EVar13;
          if (EVar13 != WINDOW_AGGREGATE) {
            if (EVar13 == INVALID) {
              pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"Unknown/unsupported window function","");
              InternalException::InternalException(pIVar28,(string *)local_1c8);
              __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            if (*(char *)(in_RDX + 0x2b) == '\x01') {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,
                         "DISTINCT is not implemented for non-aggregate window functions!","");
              ParserException::ParserException(pPVar17,(string *)local_1c8);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          if (*(long *)(in_RDX + 0x18) != 0) {
            uVar29 = EVar13 - 0x6e;
            if (0x18 < uVar29) {
LAB_017792ea:
              pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"Unknown orderable window type %s","");
              ExpressionTypeToString_abi_cxx11_(&local_168,(duckdb *)(ulong)EVar13,type);
              InternalException::InternalException<char_const*>
                        (pIVar28,(string *)local_1c8,local_168._M_dataplus._M_p);
              __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            if ((0x1f0f401U >> (uVar29 & 0x1f) & 1) == 0) {
              if (uVar29 == 0xb) {
                pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                local_1c8._0_8_ = local_1b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,
                           "ORDER BY is not supported for the window function \"%s\"","");
                ParserException::ParserException<char_const*>
                          (pPVar17,(string *)local_1c8,lowercase_name._M_dataplus._M_p);
                __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              goto LAB_017792ea;
            }
          }
          if ((EVar13 != WINDOW_AGGREGATE) && (*(long *)(in_RDX + 0x20) != 0)) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1c8._0_8_ = local_1b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,
                       "FILTER is not implemented for non-aggregate window functions!","");
            ParserException::ParserException(pPVar17,(string *)local_1c8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (*(char *)(in_RDX + 0x28) == '\x01') {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1c8._0_8_ = local_1b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"EXPORT_STATE is not supported for window functions!","")
            ;
            ParserException::ParserException(pPVar17,(string *)local_1c8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if ((EVar13 == WINDOW_AGGREGATE) && (*(int *)(in_RDX + 0x2c) != 0)) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1c8._0_8_ = local_1b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,
                       "RESPECT/IGNORE NULLS is not supported for windowed aggregates","");
            ParserException::ParserException(pPVar17,(string *)local_1c8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          make_uniq<duckdb::WindowExpression,duckdb::ExpressionType_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&>
                    ((duckdb *)&local_168,&win_fun_type,&catalog,&schema,&lowercase_name);
          iVar15 = *(int *)(in_RDX + 0x2c);
          pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                  *)&local_168);
          pWVar18->ignore_nulls = iVar15 == 2;
          bVar12 = *(bool *)(in_RDX + 0x2b);
          pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                  *)&local_168);
          pWVar18->distinct = bVar12;
          if (*(long *)(in_RDX + 0x20) != 0) {
            TransformExpression((Transformer *)local_1c8,
                                (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
            pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                      ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                    *)&local_168);
            uVar7 = local_1c8._0_8_;
            local_1c8._0_8_ = (OperatorExpression *)0x0;
            _Var3._M_head_impl =
                 (pWVar18->filter_expr).
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pWVar18->filter_expr).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)uVar7;
            if ((_Var3._M_head_impl != (ParsedExpression *)0x0) &&
               ((**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))(),
               (OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)0x0)) {
              (**(code **)(*(long *)local_1c8._0_8_ + 8))();
            }
          }
          pPVar4 = *(PGList **)(in_RDX + 0x18);
          if (pPVar4 != (PGList *)0x0) {
            window_spec.ptr = (PGWindowDef *)operator_new(0x28);
            *(undefined1 *)&(window_spec.ptr)->name = 2;
            *(undefined ***)window_spec.ptr = &PTR__OrderModifier_02432d28;
            (window_spec.ptr)->refname = (char *)0x0;
            (window_spec.ptr)->partitionClause = (PGList *)0x0;
            (window_spec.ptr)->orderClause = (PGList *)0x0;
            pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                    *)&window_spec);
            TransformOrderBy((Transformer *)root,pPVar4,&pOVar19->orders);
            pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                    *)&window_spec);
            pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                      ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                    *)&local_168);
            local_1b8._0_8_ =
                 (pWVar18->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            pOVar6 = (pOVar19->orders).
                     super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            local_1c8._0_8_ =
                 (pWVar18->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_1c8._8_8_ =
                 (pWVar18->arg_orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pWVar18->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pOVar19->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pWVar18->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish = pOVar6;
            (pWVar18->arg_orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pOVar19->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pOVar19->orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pOVar19->orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pOVar19->orders).
            super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
            super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
                      ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                       local_1c8);
            if (window_spec.ptr != (PGWindowDef *)0x0) {
              (**(code **)(*(long *)window_spec.ptr + 8))();
            }
          }
          if (win_fun_type == WINDOW_AGGREGATE) {
            pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                      ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                    *)&local_168);
            local_1b8._0_8_ =
                 (pWVar18->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pWVar18->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188.index;
            local_1c8._0_8_ =
                 (pWVar18->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_1c8._8_8_ =
                 (pWVar18->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pWVar18->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._M_allocated_capacity;
            (pWVar18->children).
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
            local_198._M_allocated_capacity = 0;
            local_198._8_8_ = (pointer)0x0;
            local_188.index = 0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                       *)local_1c8);
          }
          else {
            if (local_198._M_allocated_capacity != local_198._8_8_) {
              pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                        ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                      *)&local_168);
              pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                      *)&local_198,0);
              ::std::
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                          *)&pWVar18->children,pvVar20);
            }
            if ((win_fun_type & 0xfe) == WINDOW_LEAD) {
              if (8 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
                pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                        *)&local_198,1);
                pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                          ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                        *)&local_168);
                _Var3._M_head_impl =
                     (pvVar20->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                (pvVar20->
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     (ParsedExpression *)0x0;
                _Var5._M_head_impl =
                     (pWVar18->offset_expr).
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                (pWVar18->offset_expr).
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     _Var3._M_head_impl;
                if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
                  (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
                }
              }
              if (0x10 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
                pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                        *)&local_198,2);
                pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                          ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                        *)&local_168);
                _Var3._M_head_impl =
                     (pvVar20->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                (pvVar20->
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     (ParsedExpression *)0x0;
                _Var5._M_head_impl =
                     (pWVar18->default_expr).
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                (pWVar18->default_expr).
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     _Var3._M_head_impl;
                if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
                  (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
                }
              }
              if (0x18 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
                pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                local_1c8._0_8_ = local_1b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8,"Incorrect number of parameters for function %s","");
                local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_50,lowercase_name._M_dataplus._M_p,
                           lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
                ParserException::ParserException<std::__cxx11::string>
                          (pPVar17,(string *)local_1c8,&local_50);
                __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
            }
            else if (win_fun_type == WINDOW_NTH_VALUE) {
              if (8 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
                pWVar18 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                          ::operator->((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                        *)&local_168);
                pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                        *)&local_198,1);
                ::std::
                vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                            *)&pWVar18->children,pvVar20);
                if (0x10 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
                  pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
                  local_1c8._0_8_ = local_1b8;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8,"Incorrect number of parameters for function %s",""
                            );
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_70,lowercase_name._M_dataplus._M_p,
                             lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
                  ParserException::ParserException<std::__cxx11::string>
                            (pPVar17,(string *)local_1c8,&local_70);
                  __cxa_throw(pPVar17,&ParserException::typeinfo,
                              ::std::runtime_error::~runtime_error);
                }
              }
            }
            else if (8 < (ulong)(local_198._8_8_ - local_198._0_8_)) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"Incorrect number of parameters for function %s","");
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,lowercase_name._M_dataplus._M_p,
                         lowercase_name._M_dataplus._M_p + lowercase_name._M_string_length);
              ParserException::ParserException<std::__cxx11::string>
                        (pPVar17,(string *)local_1c8,&local_90);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          window_spec.ptr = *(PGWindowDef **)(in_RDX + 0x38);
          optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
          if ((window_spec.ptr)->name != (char *)0x0) {
            optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
            ::std::__cxx11::string::string
                      ((string *)local_1c8,(window_spec.ptr)->name,(allocator *)&window_ref);
            iVar21 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&root[1].args,(key_type *)local_1c8);
            if ((OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)local_1b8) {
              operator_delete((void *)local_1c8._0_8_);
            }
            if (iVar21.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = (OperatorExpression *)local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"window \"%s\" does not exist","");
              optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
              ParserException::ParserException<char*>
                        (pPVar17,(string *)local_1c8,(window_spec.ptr)->name);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            window_spec.ptr =
                 *(PGWindowDef **)
                  ((long)iVar21.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                         ._M_cur + 0x28);
          }
          window_ref.ptr = window_spec.ptr;
          optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref);
          pcVar31 = (window_ref.ptr)->refname;
          optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref);
          if ((window_ref.ptr)->refname != (char *)0x0) {
            optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
            ::std::__cxx11::string::string
                      ((string *)local_1c8,(window_spec.ptr)->refname,(allocator *)&local_b8);
            iVar21 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&root[1].args,(key_type *)local_1c8);
            if ((OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)local_1b8) {
              operator_delete((void *)local_1c8._0_8_);
            }
            if (iVar21.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = (OperatorExpression *)local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"window \"%s\" does not exist","");
              optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
              ParserException::ParserException<char*>
                        (pPVar17,(string *)local_1c8,(window_spec.ptr)->refname);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            window_ref.ptr =
                 *(PGWindowDef **)
                  ((long)iVar21.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>,_true>
                         ._M_cur + 0x28);
            optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref);
            if ((((window_ref.ptr)->startOffset != (PGNode *)0x0) ||
                (optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref),
                (window_ref.ptr)->endOffset != (PGNode *)0x0)) ||
               (optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref),
               (window_ref.ptr)->frameOptions != 0x422)) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = (OperatorExpression *)local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,
                         "cannot copy window \"%s\" because it has a frame clause","");
              optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
              ParserException::ParserException<char*>
                        (pPVar17,(string *)local_1c8,(window_spec.ptr)->refname);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
          }
          root[2].func_variadic = true;
          optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_ref);
          oVar8 = window_ref;
          pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                 *)&local_168);
          TransformWindowDef((Transformer *)root,oVar8.ptr,pWVar22,(char *)0x0);
          if (window_ref.ptr != window_spec.ptr) {
            optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
            oVar8 = window_spec;
            pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                      ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                   *)&local_168);
            TransformWindowDef((Transformer *)root,oVar8.ptr,pWVar22,pcVar31);
          }
          optional_ptr<duckdb_libpgquery::PGWindowDef,_true>::CheckValid(&window_spec);
          oVar8 = window_spec;
          pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                 *)&local_168);
          TransformWindowFrame((Transformer *)root,oVar8.ptr,pWVar22);
          root[2].func_variadic = false;
          pWVar22 = unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                    ::operator*((unique_ptr<duckdb::WindowExpression,_std::default_delete<duckdb::WindowExpression>,_true>
                                 *)&local_168);
          SetQueryLocation(&pWVar22->super_ParsedExpression,*(int *)(in_RDX + 0x40));
          ((BaseExpression *)
          local_148._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->
          _vptr_BaseExpression = (_func_int **)local_168._M_dataplus._M_p;
          goto LAB_01778b49;
        }
        optional_ptr<duckdb::Transformer,_true>::CheckValid
                  ((optional_ptr<duckdb::Transformer,_true> *)this_02);
        this_02 = *(PGFuncCall **)this_02;
      } while (this_02[2].func_variadic != true);
    }
    pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
    local_1c8._0_8_ = local_1b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"window functions are not allowed in window definitions","");
    ParserException::ParserException(pPVar17,(string *)local_1c8);
    __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)(in_RDX + 0x2c) != 0) {
    pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
    local_1c8._0_8_ = local_1b8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"RESPECT/IGNORE NULLS is not supported for non-window functions",
               "");
    ParserException::ParserException(pPVar17,(string *)local_1c8);
    __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  window_spec.ptr = (PGWindowDef *)0x0;
  if (*(long *)(in_RDX + 0x20) != 0) {
    TransformExpression((Transformer *)local_1c8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    oVar8 = window_spec;
    window_spec.ptr = (PGWindowDef *)local_1c8._0_8_;
    local_1c8._0_8_ = (OperatorExpression *)0x0;
    if ((oVar8.ptr != (PGWindowDef *)0x0) &&
       ((**(code **)(*(long *)oVar8.ptr + 8))(),
       (OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)0x0)) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
  }
  window_ref.ptr = (PGWindowDef *)operator_new(0x28);
  *(undefined1 *)&(window_ref.ptr)->name = 2;
  *(undefined ***)window_ref.ptr = &PTR__OrderModifier_02432d28;
  (window_ref.ptr)->refname = (char *)0x0;
  (window_ref.ptr)->partitionClause = (PGList *)0x0;
  (window_ref.ptr)->orderClause = (PGList *)0x0;
  pPVar4 = *(PGList **)(in_RDX + 0x18);
  pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        *)&window_ref);
  TransformOrderBy((Transformer *)root,pPVar4,&pOVar19->orders);
  if (*(char *)(in_RDX + 0x29) == '\x01') {
    pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)&window_ref);
    if ((long)(pOVar19->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar19->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) {
      pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
      local_1c8._0_8_ = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Cannot use multiple ORDER BY clauses with WITHIN GROUP","");
      ParserException::ParserException(pPVar17,(string *)local_1c8);
      __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar15 == 0) {
      if (local_198._8_8_ - local_198._0_8_ != 8) {
        pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Wrong number of arguments for PERCENTILE_CONT","");
        ParserException::ParserException(pPVar17,(string *)local_1c8);
        __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pcVar31 = "quantile_cont";
    }
    else {
      iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar15 == 0) {
        if (local_198._8_8_ - local_198._0_8_ != 8) {
          pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
          local_1c8._0_8_ = local_1b8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Wrong number of arguments for PERCENTILE_DISC","");
          ParserException::ParserException(pPVar17,(string *)local_1c8);
          __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pcVar31 = "quantile_disc";
      }
      else {
        pcVar31 = "mode";
        iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
        if (iVar15 != 0) {
          pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
          local_1c8._0_8_ = local_1b8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Unknown ordered aggregate \"%s\".","");
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,function_name._M_dataplus._M_p,
                     function_name._M_dataplus._M_p + function_name._M_string_length);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar17,(string *)local_1c8,&local_b0);
          __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (local_198._M_allocated_capacity != local_198._8_8_) {
          pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
          local_1c8._0_8_ = local_1b8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8,"Wrong number of arguments for MODE","");
          ParserException::ParserException(pPVar17,(string *)local_1c8);
          __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&lowercase_name,0,(char *)lowercase_name._M_string_length,(ulong)pcVar31);
  }
  iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
  if ((iVar15 == 0) && (local_198._M_allocated_capacity == local_198._8_8_)) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&lowercase_name,0,(char *)lowercase_name._M_string_length,0x1d916f7);
  }
  iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
  if (iVar15 == 0) {
    if (local_198._8_8_ - local_198._0_8_ != 0x18) {
      pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
      local_1c8._0_8_ = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Wrong number of arguments to IF.","");
      ParserException::ParserException(pPVar17,(string *)local_1c8);
      __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (CaseExpression *)operator_new(0x58);
    CaseExpression::CaseExpression(this_01);
    local_1c8._0_8_ = (PGValue *)0x0;
    local_1c8._8_8_ =
         (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
          )0x0;
    local_168._M_dataplus._M_p = (pointer)this_01;
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_198,0);
    _Var3._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if ((PGValue *)local_1c8._0_8_ != (PGValue *)0x0) {
      lVar1 = *(long *)local_1c8._0_8_;
      local_1c8._0_8_ = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = (ParsedExpression *)local_1c8._0_8_;
    }
    local_1c8._0_8_ = _Var3._M_head_impl;
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_198,1);
    _Var3._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_1c8._8_8_ != (ParsedExpression *)0x0) {
      lVar1 = *(long *)local_1c8._8_8_;
      local_1c8._8_8_ = _Var3._M_head_impl;
      (**(code **)(lVar1 + 8))();
      _Var3._M_head_impl = (ParsedExpression *)local_1c8._8_8_;
    }
    local_1c8._8_8_ = _Var3._M_head_impl;
    pCVar24 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_168);
    ::std::vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>::
    emplace_back<duckdb::CaseCheck>
              (&(pCVar24->case_checks).
                super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>,
               (CaseCheck *)local_1c8);
    pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)&local_198,2);
    pCVar24 = unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
              ::operator->((unique_ptr<duckdb::CaseExpression,_std::default_delete<duckdb::CaseExpression>,_true>
                            *)&local_168);
    _Var3._M_head_impl =
         (pvVar20->
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar20->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    _Var5._M_head_impl =
         (pCVar24->else_expr).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar24->else_expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
    }
    _Var10._M_p = local_168._M_dataplus._M_p;
    local_168._M_dataplus._M_p = (pointer)0x0;
    ((BaseExpression *)
    local_148._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->_vptr_BaseExpression =
         (_func_int **)_Var10._M_p;
    if ((ParserOptions *)local_1c8._8_8_ != (ParserOptions *)0x0) {
      (*((BaseExpression *)local_1c8._8_8_)->_vptr_BaseExpression[1])();
    }
    local_1c8._8_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    if ((OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
    if ((_func_int **)local_168._M_dataplus._M_p != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_168._M_dataplus._M_p + 8))();
    }
    goto LAB_01778b29;
  }
  iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
  if (iVar15 == 0) {
    if (local_198._8_8_ - local_198._0_8_ != 8) {
      pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
      local_1c8._0_8_ = local_1b8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Wrong number of arguments to the UNPACK operator","");
      ParserException::ParserException(pPVar17,(string *)local_1c8);
      __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar25._M_t.
    super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
    .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
          )operator_new(0x50);
    local_1c8._0_8_ = (PGValue *)0x0;
    local_168._M_dataplus._M_p = (pointer)0x0;
    OperatorExpression::OperatorExpression
              ((OperatorExpression *)
               uVar25._M_t.
               super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
               .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
               OPERATOR_UNPACK,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_1c8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_168);
    _win_fun_type =
         (FunctionExpression *)
         uVar25._M_t.
         super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
         .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
    if ((long *)local_168._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_168._M_dataplus._M_p + 8))();
    }
    local_168._M_dataplus._M_p = (pointer)0x0;
    if ((PGValue *)local_1c8._0_8_ != (PGValue *)0x0) {
      (**(code **)(*(long *)local_1c8._0_8_ + 8))();
    }
    pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
              ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                            *)&win_fun_type);
LAB_01778959:
    local_1b8._0_8_ =
         (pOVar26->children).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pOVar26->children).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_188.index;
    local_1c8._0_8_ =
         (pOVar26->children).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8._8_8_ =
         (pOVar26->children).
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pOVar26->children).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_198._M_allocated_capacity;
    (pOVar26->children).
    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_198._8_8_;
    local_198._M_allocated_capacity = 0;
    local_198._8_8_ = (pointer)0x0;
    local_188.index = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_1c8);
    _Var27._M_head_impl = _win_fun_type;
  }
  else {
    iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar15 == 0) {
      if (local_198._8_8_ - local_198._0_8_ != 8) {
        pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Wrong number of arguments provided to TRY expression","");
        ParserException::ParserException(pPVar17,(string *)local_1c8);
        __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar25._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
            )operator_new(0x50);
      local_1c8._0_8_ = (PGValue *)0x0;
      local_168._M_dataplus._M_p = (pointer)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)
                 uVar25._M_t.
                 super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                 .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
                 OPERATOR_TRY,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_1c8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_168);
      _win_fun_type =
           (FunctionExpression *)
           uVar25._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      if ((long *)local_168._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_168._M_dataplus._M_p + 8))();
      }
      local_168._M_dataplus._M_p = (pointer)0x0;
      if ((PGValue *)local_1c8._0_8_ != (PGValue *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)&win_fun_type);
      goto LAB_01778959;
    }
    iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar15 == 0) {
      uVar25._M_t.
      super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
      .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true,_true>
            )operator_new(0x50);
      local_1c8._0_8_ = (PGValue *)0x0;
      local_168._M_dataplus._M_p = (pointer)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)
                 uVar25._M_t.
                 super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
                 .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl,
                 ARRAY_CONSTRUCTOR,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_1c8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_168);
      _win_fun_type =
           (FunctionExpression *)
           uVar25._M_t.
           super___uniq_ptr_impl<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionExpression_*,_std::default_delete<duckdb::FunctionExpression>_>
           .super__Head_base<0UL,_duckdb::FunctionExpression_*,_false>._M_head_impl;
      if ((long *)local_168._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_168._M_dataplus._M_p + 8))();
      }
      local_168._M_dataplus._M_p = (pointer)0x0;
      if ((PGValue *)local_1c8._0_8_ != (PGValue *)0x0) {
        (**(code **)(*(long *)local_1c8._0_8_ + 8))();
      }
      pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)&win_fun_type);
      goto LAB_01778959;
    }
    iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
    if (iVar15 == 0) {
      if (local_198._8_8_ - local_198._0_8_ != 0x10) {
        pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Wrong number of arguments to __internal_position_operator.",
                   "");
        ParserException::ParserException(pPVar17,(string *)local_1c8);
        __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)&local_198,0);
      __b = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          *)&local_198,1);
      ::std::
      swap<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                (pvVar20,__b);
      ::std::__cxx11::string::operator=((string *)&lowercase_name,"position");
LAB_01778a0c:
      local_168._M_dataplus._M_p = lowercase_name._M_dataplus._M_p;
      _win_fun_type = _win_fun_type & 0xffffffffffffff00;
      make_uniq<duckdb::FunctionExpression,std::__cxx11::string,std::__cxx11::string,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                ((duckdb *)local_1c8,&catalog,&schema,(char **)&local_168,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_198,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&window_spec,
                 (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  *)&window_ref,(bool *)(in_RDX + 0x2b),(bool *)&win_fun_type,
                 (bool *)(in_RDX + 0x28));
      expr = unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
             ::operator*((unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                          *)local_1c8);
      SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x40));
      _Var27._M_head_impl = (FunctionExpression *)local_1c8._0_8_;
    }
    else {
      iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
      if (iVar15 != 0) {
        iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
        if ((iVar15 == 0) &&
           (pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                    *)&window_ref),
           (long)(pOVar19->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pOVar19->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_start == 0x10)) {
          if (local_198._8_8_ - local_198._0_8_ != 8) {
            pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
            local_1c8._0_8_ = local_1b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,"Wrong number of arguments to LIST.","");
            ParserException::ParserException(pPVar17,(string *)local_1c8);
            __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                  *)&local_198,0);
          _Var3._M_head_impl =
               (pvVar20->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          pOVar19 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                    ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                  *)&window_ref);
          pvVar23 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar19->orders,0);
          pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pvVar23->expression);
          cVar14 = (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 0x50))
                             (_Var3._M_head_impl,pPVar16);
          if (cVar14 != '\0') {
            local_168._M_dataplus._M_p = EnumUtil::ToChars<duckdb::OrderType>(pvVar23->type);
            make_uniq<duckdb::ConstantExpression,char_const*>
                      ((duckdb *)local_1c8,(char **)&local_168);
            _win_fun_type =
                 (FunctionExpression *)
                 EnumUtil::ToChars<duckdb::OrderByNullType>(pvVar23->null_order);
            make_uniq<duckdb::ConstantExpression,char_const*>
                      ((duckdb *)&local_168,(char **)&win_fun_type);
            oVar8 = window_ref;
            window_ref.ptr = (PGWindowDef *)0x0;
            if (oVar8.ptr != (PGWindowDef *)0x0) {
              (**(code **)(*(long *)oVar8.ptr + 8))();
            }
            local_b8 = lowercase_name._M_dataplus._M_p;
            local_139 = false;
            make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,std::__cxx11::string&,char_const*,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::OrderModifier,std::default_delete<duckdb::OrderModifier>,true>,bool&,bool,bool&>
                      ((duckdb *)&win_fun_type,&catalog,&schema,&local_b8,
                       (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)&local_198,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)&window_spec,
                       (unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        *)&window_ref,(bool *)(in_RDX + 0x2b),&local_139,(bool *)(in_RDX + 0x28));
            ::std::__cxx11::string::operator=((string *)&lowercase_name,"list_sort");
            oVar8 = window_ref;
            window_ref.ptr = (PGWindowDef *)0x0;
            if (oVar8.ptr != (PGWindowDef *)0x0) {
              (**(code **)(*(long *)oVar8.ptr + 8))();
            }
            oVar8.ptr = window_spec.ptr;
            window_spec.ptr = (PGWindowDef *)0x0;
            if (oVar8.ptr != (PGWindowDef *)0x0) {
              (**(code **)(*(long *)oVar8.ptr + 8))();
            }
            uVar9 = local_198._8_8_;
            uVar7 = local_198._M_allocated_capacity;
            uVar30 = local_198._M_allocated_capacity;
            if (local_198._8_8_ != local_198._M_allocated_capacity) {
              do {
                _Var3._M_head_impl =
                     (((pointer)uVar30)->
                     super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     )._M_t.
                     super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
                if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
                  (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
                }
                (((pointer)uVar30)->
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                     (ParsedExpression *)0x0;
                uVar30 = uVar30 + 8;
              } while (uVar30 != uVar9);
              local_198._8_8_ = uVar7;
            }
            *(bool *)(in_RDX + 0x2b) = false;
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::FunctionExpression,std::default_delete<duckdb::FunctionExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&local_198,
                       (unique_ptr<duckdb::FunctionExpression,_std::default_delete<duckdb::FunctionExpression>,_true>
                        *)&win_fun_type);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&local_198,
                       (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                        *)local_1c8);
            ::std::
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                        *)&local_198,
                       (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                        *)&local_168);
            if (_win_fun_type != (FunctionExpression *)0x0) {
              (**(code **)(*(long *)_win_fun_type + 8))();
            }
            if ((long *)local_168._M_dataplus._M_p != (long *)0x0) {
              (**(code **)(*(long *)local_168._M_dataplus._M_p + 8))();
            }
            if ((OperatorExpression *)local_1c8._0_8_ != (OperatorExpression *)0x0) {
              (**(code **)(*(long *)local_1c8._0_8_ + 8))();
            }
          }
        }
        else {
          iVar15 = ::std::__cxx11::string::compare((char *)&lowercase_name);
          if (iVar15 == 0) {
            if (local_198._8_8_ - local_198._0_8_ != 8) {
              pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
              local_1c8._0_8_ = local_1b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8,"Wrong number of arguments provided to DATE function",
                         "");
              ParserException::ParserException(pPVar17,(string *)local_1c8);
              __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                    *)&local_198,0);
            make_uniq<duckdb::CastExpression,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                      ((duckdb *)local_1c8,&LogicalType::DATE,pvVar20);
            _Var27._M_head_impl = (FunctionExpression *)local_1c8._0_8_;
            goto LAB_01778b1e;
          }
        }
        goto LAB_01778a0c;
      }
      if (local_198._8_8_ - local_198._0_8_ != 0x10) {
        pPVar17 = (ParserException *)__cxa_allocate_exception(0x10);
        local_1c8._0_8_ = local_1b8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Wrong number of arguments to IFNULL.","");
        ParserException::ParserException(pPVar17,(string *)local_1c8);
        __cxa_throw(pPVar17,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_168._M_dataplus._M_p._0_1_ = 0x98;
      make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>
                ((duckdb *)local_1c8,(ExpressionType *)&local_168);
      pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)local_1c8);
      pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)&local_198,0);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pOVar26->children,pvVar20);
      pOVar26 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                              *)local_1c8);
      pvVar20 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)&local_198,1);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pOVar26->children,pvVar20);
      _Var27._M_head_impl = (FunctionExpression *)local_1c8._0_8_;
    }
  }
LAB_01778b1e:
  ((BaseExpression *)
  local_148._M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->_vptr_BaseExpression =
       (_func_int **)_Var27._M_head_impl;
LAB_01778b29:
  if (window_ref.ptr != (PGWindowDef *)0x0) {
    (**(code **)(*(long *)window_ref.ptr + 8))();
  }
  if (window_spec.ptr != (PGWindowDef *)0x0) {
    (**(code **)(*(long *)window_spec.ptr + 8))();
  }
LAB_01778b49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lowercase_name._M_dataplus._M_p != &lowercase_name.field_2) {
    operator_delete(lowercase_name._M_dataplus._M_p);
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)function_name._M_dataplus._M_p != &function_name.field_2) {
    operator_delete(function_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)schema._M_dataplus._M_p != &schema.field_2) {
    operator_delete(schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)catalog._M_dataplus._M_p != &catalog.field_2) {
    operator_delete(catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )local_148._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformFuncCall(duckdb_libpgquery::PGFuncCall &root) {
	auto name = root.funcname;
	string catalog, schema, function_name;
	if (name->length == 3) {
		// catalog + schema + name
		catalog = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->next->data.ptr_value)->val.str;
	} else if (name->length == 2) {
		// schema + name
		catalog = INVALID_CATALOG;
		schema = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->next->data.ptr_value)->val.str;
	} else if (name->length == 1) {
		// unqualified name
		catalog = INVALID_CATALOG;
		schema = INVALID_SCHEMA;
		function_name = PGPointerCast<duckdb_libpgquery::PGValue>(name->head->data.ptr_value)->val.str;
	} else {
		throw ParserException("TransformFuncCall - Expected 1, 2 or 3 qualifications");
	}

	//  transform children
	vector<unique_ptr<ParsedExpression>> children;
	if (root.args) {
		TransformExpressionList(*root.args, children);
	}
	if (children.size() == 1 && ExpressionIsEmptyStar(*children[0]) && !root.agg_distinct && !root.agg_order) {
		// COUNT(*) gets translated into COUNT()
		children.clear();
	}

	auto lowercase_name = StringUtil::Lower(function_name);
	if (root.over) {
		if (InWindowDefinition()) {
			throw ParserException("window functions are not allowed in window definitions");
		}

		const auto win_fun_type = WindowExpression::WindowToExpressionType(lowercase_name);
		if (win_fun_type == ExpressionType::INVALID) {
			throw InternalException("Unknown/unsupported window function");
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_distinct) {
			throw ParserException("DISTINCT is not implemented for non-aggregate window functions!");
		}

		if (root.agg_order && !IsOrderableWindowFunction(win_fun_type)) {
			throw ParserException("ORDER BY is not supported for the window function \"%s\"", lowercase_name.c_str());
		}

		if (win_fun_type != ExpressionType::WINDOW_AGGREGATE && root.agg_filter) {
			throw ParserException("FILTER is not implemented for non-aggregate window functions!");
		}
		if (root.export_state) {
			throw ParserException("EXPORT_STATE is not supported for window functions!");
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE &&
		    root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
			throw ParserException("RESPECT/IGNORE NULLS is not supported for windowed aggregates");
		}

		auto expr = make_uniq<WindowExpression>(win_fun_type, std::move(catalog), std::move(schema), lowercase_name);
		expr->ignore_nulls = (root.agg_ignore_nulls == duckdb_libpgquery::PG_IGNORE_NULLS);
		expr->distinct = root.agg_distinct;

		if (root.agg_filter) {
			auto filter_expr = TransformExpression(root.agg_filter);
			expr->filter_expr = std::move(filter_expr);
		}

		if (root.agg_order) {
			auto order_bys = make_uniq<OrderModifier>();
			TransformOrderBy(root.agg_order, order_bys->orders);
			expr->arg_orders = std::move(order_bys->orders);
		}

		if (win_fun_type == ExpressionType::WINDOW_AGGREGATE) {
			expr->children = std::move(children);
		} else {
			if (!children.empty()) {
				expr->children.push_back(std::move(children[0]));
			}
			if (win_fun_type == ExpressionType::WINDOW_LEAD || win_fun_type == ExpressionType::WINDOW_LAG) {
				if (children.size() > 1) {
					expr->offset_expr = std::move(children[1]);
				}
				if (children.size() > 2) {
					expr->default_expr = std::move(children[2]);
				}
				if (children.size() > 3) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else if (win_fun_type == ExpressionType::WINDOW_NTH_VALUE) {
				if (children.size() > 1) {
					expr->children.push_back(std::move(children[1]));
				}
				if (children.size() > 2) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			} else {
				if (children.size() > 1) {
					throw ParserException("Incorrect number of parameters for function %s", lowercase_name);
				}
			}
		}
		auto window_spec = PGPointerCast<duckdb_libpgquery::PGWindowDef>(root.over);
		if (window_spec->name) {
			auto it = window_clauses.find(string(window_spec->name));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->name);
			}
			window_spec = it->second;
			D_ASSERT(window_spec);
		}
		auto window_ref = window_spec;
		auto window_name = window_ref->refname;
		if (window_ref->refname) {
			auto it = window_clauses.find(string(window_spec->refname));
			if (it == window_clauses.end()) {
				throw ParserException("window \"%s\" does not exist", window_spec->refname);
			}
			window_ref = it->second;
			D_ASSERT(window_ref);
			if (window_ref->startOffset || window_ref->endOffset || window_ref->frameOptions != FRAMEOPTION_DEFAULTS) {
				throw ParserException("cannot copy window \"%s\" because it has a frame clause", window_spec->refname);
			}
		}
		in_window_definition = true;
		TransformWindowDef(*window_ref, *expr);
		if (window_ref != window_spec) {
			TransformWindowDef(*window_spec, *expr, window_name);
		}
		TransformWindowFrame(*window_spec, *expr);
		in_window_definition = false;
		SetQueryLocation(*expr, root.location);
		return std::move(expr);
	}

	if (root.agg_ignore_nulls != duckdb_libpgquery::PG_DEFAULT_NULLS) {
		throw ParserException("RESPECT/IGNORE NULLS is not supported for non-window functions");
	}

	unique_ptr<ParsedExpression> filter_expr;
	if (root.agg_filter) {
		filter_expr = TransformExpression(root.agg_filter);
	}

	auto order_bys = make_uniq<OrderModifier>();
	TransformOrderBy(root.agg_order, order_bys->orders);

	// Ordered aggregates can be either WITHIN GROUP or after the function arguments
	if (root.agg_within_group) {
		//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
		//  Since we implement "ordered aggregates" without sorting,
		//  we map all the ones we support to the corresponding aggregate function.
		if (order_bys->orders.size() != 1) {
			throw ParserException("Cannot use multiple ORDER BY clauses with WITHIN GROUP");
		}
		if (lowercase_name == "percentile_cont") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_CONT");
			}
			lowercase_name = "quantile_cont";
		} else if (lowercase_name == "percentile_disc") {
			if (children.size() != 1) {
				throw ParserException("Wrong number of arguments for PERCENTILE_DISC");
			}
			lowercase_name = "quantile_disc";
		} else if (lowercase_name == "mode") {
			if (!children.empty()) {
				throw ParserException("Wrong number of arguments for MODE");
			}
			lowercase_name = "mode";
		} else {
			throw ParserException("Unknown ordered aggregate \"%s\".", function_name);
		}
	}

	// star gets eaten in the parser
	if (lowercase_name == "count" && children.empty()) {
		lowercase_name = "count_star";
	}

	if (lowercase_name == "if") {
		if (children.size() != 3) {
			throw ParserException("Wrong number of arguments to IF.");
		}
		auto expr = make_uniq<CaseExpression>();
		CaseCheck check;
		check.when_expr = std::move(children[0]);
		check.then_expr = std::move(children[1]);
		expr->case_checks.push_back(std::move(check));
		expr->else_expr = std::move(children[2]);
		return std::move(expr);
	} else if (lowercase_name == "unpack") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to the UNPACK operator");
		}
		auto expr = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_UNPACK);
		expr->children = std::move(children);
		return std::move(expr);
	} else if (lowercase_name == "try") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to TRY expression");
		}
		auto try_expression = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_TRY);
		try_expression->children = std::move(children);
		return std::move(try_expression);
	} else if (lowercase_name == "construct_array") {
		auto construct_array = make_uniq<OperatorExpression>(ExpressionType::ARRAY_CONSTRUCTOR);
		construct_array->children = std::move(children);
		return std::move(construct_array);
	} else if (lowercase_name == "__internal_position_operator") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to __internal_position_operator.");
		}
		// swap arguments for POSITION(x IN y)
		std::swap(children[0], children[1]);
		lowercase_name = "position";
	} else if (lowercase_name == "ifnull") {
		if (children.size() != 2) {
			throw ParserException("Wrong number of arguments to IFNULL.");
		}

		//  Two-argument COALESCE
		auto coalesce_op = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
		coalesce_op->children.push_back(std::move(children[0]));
		coalesce_op->children.push_back(std::move(children[1]));
		return std::move(coalesce_op);
	} else if (lowercase_name == "list" && order_bys->orders.size() == 1) {
		// list(expr ORDER BY expr <sense> <nulls>) => list_sort(list(expr), <sense>, <nulls>)
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments to LIST.");
		}
		auto arg_expr = children[0].get();
		auto &order_by = order_bys->orders[0];
		if (arg_expr->Equals(*order_by.expression)) {
			auto sense = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.type));
			auto nulls = make_uniq<ConstantExpression>(EnumUtil::ToChars(order_by.null_order));
			order_bys = nullptr;
			auto unordered = make_uniq<FunctionExpression>(catalog, schema, lowercase_name.c_str(), std::move(children),
			                                               std::move(filter_expr), std::move(order_bys),
			                                               root.agg_distinct, false, root.export_state);
			lowercase_name = "list_sort";
			order_bys.reset();   // NOLINT
			filter_expr.reset(); // NOLINT
			children.clear();    // NOLINT
			root.agg_distinct = false;
			children.emplace_back(std::move(unordered));
			children.emplace_back(std::move(sense));
			children.emplace_back(std::move(nulls));
		}
	} else if (lowercase_name == "date") {
		if (children.size() != 1) {
			throw ParserException("Wrong number of arguments provided to DATE function");
		}
		return std::move(make_uniq<CastExpression>(LogicalType::DATE, std::move(children[0])));
	}

	auto function = make_uniq<FunctionExpression>(std::move(catalog), std::move(schema), lowercase_name.c_str(),
	                                              std::move(children), std::move(filter_expr), std::move(order_bys),
	                                              root.agg_distinct, false, root.export_state);
	SetQueryLocation(*function, root.location);

	return std::move(function);
}